

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O2

bool __thiscall
I2Cdev::writeBits(I2Cdev *this,uint8_t regAddr,uint8_t bitStart,uint8_t length,uint8_t data)

{
  byte bVar1;
  int iVar2;
  undefined8 in_RAX;
  uint uVar3;
  undefined7 in_register_00000031;
  undefined1 uVar4;
  undefined8 uStack_38;
  
  uVar4 = 0;
  uStack_38 = in_RAX;
  iVar2 = (*(this->super_I2Cgeneric)._vptr_I2Cgeneric[8])
                    (this,CONCAT71(in_register_00000031,regAddr),(long)&uStack_38 + 7,0);
  if ((char)iVar2 != '\0') {
    uVar3 = ~(-1 << (length & 0x1f));
    bVar1 = (bitStart - length) + 1;
    bVar1 = (byte)((data & uVar3) << (bVar1 & 0x1f)) |
            ~(byte)(uVar3 << (bVar1 & 0x1f)) & uStack_38._7_1_;
    uStack_38 = CONCAT17(bVar1,(undefined7)uStack_38);
    iVar2 = (*(this->super_I2Cgeneric)._vptr_I2Cgeneric[0x18])(this,regAddr,(ulong)bVar1);
    uVar4 = (undefined1)iVar2;
  }
  return (bool)uVar4;
}

Assistant:

bool I2Cdev::writeBits(uint8_t regAddr, uint8_t bitStart, uint8_t length, uint8_t data) {
    //      010 value to write
    // 76543210 bit numbers
    //    xxx   args: bitStart=4, length=3
    // 00011100 mask byte
    // 10101111 original value (sample)
    // 10100011 original & ~mask
    // 10101011 masked | value
    uint8_t b;
    if (this->readByte(regAddr, &b) != 0) {
        uint8_t mask = ((1 << length) - 1) << (bitStart - length + 1);
        data <<= (bitStart - length + 1); // shift data into correct position
        data &= mask; // zero all non-important bits in data
        b &= ~(mask); // zero all important bits in existing byte
        b |= data; // combine data with existing byte
        return this->writeByte(regAddr, b);
    } else {
        return false;
    }
}